

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O1

string * __thiscall
elf_parser::Elf_parser::get_section_type_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,int tt)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(tt) {
  case 0:
    pcVar2 = "SHT_NULL";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "SHT_PROGBITS";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "SHT_SYMTAB";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "SHT_STRTAB";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "SHT_RELA";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "SHT_HASH";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "SHT_DYNAMIC";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "SHT_NOTE";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "SHT_NOBITS";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "SHT_REL";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "SHT_DYNSYM";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_section_type(int tt) {
    if(tt < 0)
        return "UNKNOWN";

    switch(tt) {
        case 0: return "SHT_NULL";      /* Section header table entry unused */
        case 1: return "SHT_PROGBITS";  /* Program data */
        case 2: return "SHT_SYMTAB";    /* Symbol table */
        case 3: return "SHT_STRTAB";    /* String table */
        case 4: return "SHT_RELA";      /* Relocation entries with addends */
        case 5: return "SHT_HASH";      /* Symbol hash table */
        case 6: return "SHT_DYNAMIC";   /* Dynamic linking information */
        case 7: return "SHT_NOTE";      /* Notes */
        case 8: return "SHT_NOBITS";    /* Program space with no data (bss) */
        case 9: return "SHT_REL";       /* Relocation entries, no addends */
        case 11: return "SHT_DYNSYM";   /* Dynamic linker symbol table */
        default: return "UNKNOWN";
    }
    return "UNKNOWN";
}